

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O0

void __thiscall
nowtech::memory::
PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>::
PoolAllocatorBase(PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
                  *this,size_t aPoolSize,size_t aNodeSize,Occupier *aOccupier)

{
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Occupier *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffc8;
  ulong local_28;
  
  *(Occupier **)in_RDI = in_RDI;
  in_RDI[8] = (Occupier)0x1;
  *(undefined8 *)(in_RDI + 0x10) = in_RCX;
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  *(undefined8 *)(in_RDI + 0x20) = in_RDX;
  *(ulong *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x20) + 7U >> 3;
  pvVar1 = log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier::occupy
                     (in_RDI,in_stack_ffffffffffffffc8);
  *(void **)(in_RDI + 0x30) = pvVar1;
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RDI + 0x30);
  *(long *)(in_RDI + 0x40) =
       *(long *)(in_RDI + 0x38) + *(long *)(in_RDI + 0x18) * *(long *)(in_RDI + 0x28) * 8;
  for (local_28 = 0; local_28 < *(ulong *)(in_RDI + 0x18); local_28 = local_28 + 1) {
    *(ulong *)(*(long *)(in_RDI + 0x38) + local_28 * *(long *)(in_RDI + 0x28) * 8) =
         *(long *)(in_RDI + 0x38) + (local_28 + 1) * *(long *)(in_RDI + 0x28) * 8;
  }
  *(undefined8 *)
   (*(long *)(in_RDI + 0x38) + *(long *)(in_RDI + 0x18) * *(long *)(in_RDI + 0x28) * 8) = 0;
  return;
}

Assistant:

PoolAllocatorBase(size_t const aPoolSize, size_t aNodeSize, tInterface& aOccupier) noexcept
    : mOriginal(this)
    , mIsOriginal(true)
    , mOccupier(aOccupier)
    , mPoolSize(aPoolSize)
    , mNodeSize(aNodeSize)
    , mBlockSizeInPointerSize((mNodeSize + sizeof(void*) - 1u) / sizeof(void*))
    , mMemory(mOccupier.occupy(mBlockSizeInPointerSize * sizeof(void*) * (mPoolSize + 1u)))
    , mFirst(reinterpret_cast<void**>(mMemory))
    , mProhibited(mFirst + mPoolSize * mBlockSizeInPointerSize) {
    for(size_t i = 0u; i < mPoolSize; ++i) {
      mFirst[i * mBlockSizeInPointerSize] = static_cast<void*>(mFirst + (i + 1u) * mBlockSizeInPointerSize);
    }
    mFirst[mPoolSize * mBlockSizeInPointerSize] = nullptr;
  }